

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_givexp(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  CHAR_DATA *ch_00;
  CHAR_DATA *pCVar4;
  long in_RDI;
  int xp;
  CHAR_DATA *victim;
  char temp [4608];
  char arg2 [4608];
  char arg1 [4608];
  undefined4 in_stack_ffffffffffffc9d8;
  undefined4 in_stack_ffffffffffffc9dc;
  char *in_stack_ffffffffffffc9e0;
  CHAR_DATA *in_stack_ffffffffffffc9e8;
  char *in_stack_ffffffffffffc9f0;
  char local_2418 [36];
  int in_stack_ffffffffffffdc0c;
  CHAR_DATA *in_stack_ffffffffffffdc10;
  char *in_stack_ffffffffffffede0;
  CHAR_DATA *in_stack_ffffffffffffede8;
  char *in_stack_ffffffffffffedf0;
  CHAR_DATA *in_stack_ffffffffffffedf8;
  CHAR_DATA *in_stack_ffffffffffffee00;
  char *in_stack_ffffffffffffffe8;
  
  one_argument(in_stack_ffffffffffffc9e0,
               (char *)CONCAT44(in_stack_ffffffffffffc9dc,in_stack_ffffffffffffc9d8));
  ch_00 = (CHAR_DATA *)
          one_argument(in_stack_ffffffffffffc9e0,
                       (char *)CONCAT44(in_stack_ffffffffffffc9dc,in_stack_ffffffffffffc9d8));
  if (*(char *)&ch_00->next == '\0') {
    send_to_char(in_stack_ffffffffffffc9f0,in_stack_ffffffffffffc9e8);
  }
  else {
    pCVar4 = get_char_world(in_stack_ffffffffffffede8,in_stack_ffffffffffffede0);
    if (pCVar4 == (CHAR_DATA *)0x0) {
      send_to_char(in_stack_ffffffffffffc9f0,in_stack_ffffffffffffc9e8);
    }
    else {
      bVar1 = is_number((char *)CONCAT44(in_stack_ffffffffffffc9dc,in_stack_ffffffffffffc9d8));
      if (bVar1) {
        uVar2 = atoi(local_2418);
        if ((3000 < (int)uVar2) &&
           (iVar3 = get_trust((CHAR_DATA *)CONCAT44(uVar2,in_stack_ffffffffffffc9d8)), iVar3 < 0x38)
           ) {
          send_to_char(in_stack_ffffffffffffc9f0,in_stack_ffffffffffffc9e8);
          return;
        }
        bVar1 = str_cmp((char *)ch_00,"");
        if (bVar1) {
          sprintf(&stack0xffffffffffffc9e8,"%s\n\r",ch_00);
        }
        else {
          sprintf(&stack0xffffffffffffc9e8,
                  "You receive %d experience points for outstanding performance.\n\r",(ulong)uVar2);
        }
        send_to_char(in_stack_ffffffffffffc9f0,in_stack_ffffffffffffc9e8);
        gain_exp(in_stack_ffffffffffffdc10,in_stack_ffffffffffffdc0c);
        send_to_char(in_stack_ffffffffffffc9f0,in_stack_ffffffffffffc9e8);
        sprintf(&stack0xffffffffffffc9e8,"Log added: %s receives %d experience from %s.\n\r",
                pCVar4->name,(ulong)uVar2,*(undefined8 *)(in_RDI + 0xe8));
        send_to_char(in_stack_ffffffffffffc9f0,in_stack_ffffffffffffc9e8);
        sprintf(&stack0xffffffffffffc9e8,"AUTO: %s gave %d experience.\n\r",
                *(undefined8 *)(in_RDI + 0xf0),(ulong)uVar2);
        add_history(in_stack_ffffffffffffee00,in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0);
      }
      else {
        do_givexp(ch_00,in_stack_ffffffffffffffe8);
      }
    }
  }
  return;
}

Assistant:

void do_givexp(CHAR_DATA *ch, char *argument)
{
	char arg1[MSL], arg2[MSL], temp[MSL];
	CHAR_DATA *victim;
	int xp;

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);

	if (!*argument)
	{
		send_to_char("Syntax:   givexp <character> <# xp> <message they receive>\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg1);

	if (victim == nullptr)
	{
		send_to_char("You can't find them.\n\r", ch);
		return;
	}

	if (!is_number(arg2))
	{
		do_givexp(ch, "");
		return;
	}

	xp = atoi(arg2);

	if (xp > 3000 && get_trust(ch) < 56)
	{
		send_to_char("You may not give more than 3000 experience.\n\r", ch);
		return;
	}

	if (!str_cmp(argument, ""))
		sprintf(temp, "You receive %d experience points for outstanding performance.\n\r", xp);
	else
		sprintf(temp, "%s\n\r", argument);

	send_to_char(temp, victim);
	gain_exp(victim, xp);

	send_to_char("Ok.\n\r", ch);

	sprintf(temp, "Log added: %s receives %d experience from %s.\n\r", victim->name, xp, ch->name);
	send_to_char(temp, ch);

	sprintf(temp, "AUTO: %s gave %d experience.\n\r", ch->true_name, xp);
	add_history(nullptr, victim, temp);
}